

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void __thiscall DStrobe::DStrobe(DStrobe *this,sector_t *sector,int utics,int ltics,bool inSync)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00871748;
  this->m_DarkTime = ltics;
  this->m_BrightTime = utics;
  sVar1 = sector->lightlevel;
  this->m_MaxLight = (int)sVar1;
  iVar2 = sector_t::FindMinSurroundingLight(sector,(int)sVar1);
  iVar4 = 0;
  if (iVar2 != this->m_MaxLight) {
    iVar4 = iVar2;
  }
  this->m_MinLight = iVar4;
  iVar4 = 1;
  if (!inSync) {
    uVar3 = FRandom::GenRand32(&pr_strobeflash);
    iVar4 = (uVar3 & 7) + 1;
  }
  this->m_Count = iVar4;
  return;
}

Assistant:

DStrobe::DStrobe (sector_t *sector, int utics, int ltics, bool inSync)
	: DLighting (sector)
{
	m_DarkTime = ltics;
	m_BrightTime = utics;

	m_MaxLight = sector->lightlevel;
	m_MinLight = sector->FindMinSurroundingLight (sector->lightlevel);

	if (m_MinLight == m_MaxLight)
		m_MinLight = 0;

	m_Count = inSync ? 1 : (pr_strobeflash() & 7) + 1;
}